

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

void __thiscall draco::Mesh::DeleteAttribute(Mesh *this,int att_id)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer __src;
  
  PointCloud::DeleteAttribute(&this->super_PointCloud,att_id);
  if (-1 < att_id) {
    pAVar1 = (this->attribute_data_).
             super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar2 = (this->attribute_data_).
             super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (att_id < (int)((ulong)((long)pAVar2 - (long)pAVar1) >> 2)) {
      __src = pAVar1 + (ulong)(uint)att_id + 1;
      if (__src != pAVar2) {
        memmove(pAVar1 + (uint)att_id,__src,(long)pAVar2 - (long)__src);
        pAVar2 = (this->attribute_data_).
                 super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      (this->attribute_data_).
      super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>.
      _M_impl.super__Vector_impl_data._M_finish = pAVar2 + -1;
    }
  }
  return;
}

Assistant:

void DeleteAttribute(int att_id) override {
    PointCloud::DeleteAttribute(att_id);
    if (att_id >= 0 && att_id < static_cast<int>(attribute_data_.size())) {
      attribute_data_.erase(attribute_data_.begin() + att_id);
    }
  }